

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *a)

{
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RSI;
  undefined4 *in_RDI;
  long in_stack_00000028;
  long in_stack_00000030;
  long in_stack_00000038;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_00000040;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0xc) = 0;
  getWidth(in_RSI);
  getHeight(in_RSI);
  getDepth(in_RSI);
  setSize(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  memcpy(*(void **)(in_RDI + 8),in_RSI->pixel,*(long *)(in_RDI + 6) << 1);
  return;
}

Assistant:

Image(const Image<T> &a)
    {
      depth=0;
      width=0;
      height=0;
      n=0;
      pixel=0;
      row=0;
      img=0;

      setSize(a.getWidth(), a.getHeight(), a.getDepth());

      memcpy(pixel, a.pixel, n*sizeof(T));
    }